

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<char,_std::allocator<char>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<char>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<char>_> *opt)

{
  initializer_list<char> __l;
  bool bVar1;
  value_semantic_codecvt_helper<char> vVar2;
  undefined8 this_00;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *ptVar3;
  options_boost_po *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *value;
  undefined7 in_stack_ffffffffffffffb8;
  iterator pcVar4;
  size_type in_stack_ffffffffffffffd0;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *in_stack_ffffffffffffffe0;
  undefined8 uVar5;
  
  this_00 = boost::program_options::value<std::vector<char,std::allocator<char>>>();
  std::__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3865fc);
  bVar1 = typed_option<char>::default_value_supplied((typed_option<char> *)0x386604);
  if (bVar1) {
    uVar5 = this_00;
    std::
    __shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x386621);
    vVar2 = (value_semantic_codecvt_helper<char>)
            typed_option<char>::default_value((typed_option<char> *)this_00);
    ptVar3 = (typed_value<std::vector<char,_std::allocator<char>_>,_char> *)&stack0xffffffffffffffbf
    ;
    pcVar4 = (iterator)0x1;
    std::allocator<char>::allocator();
    __l._M_len = in_stack_ffffffffffffffd0;
    __l._M_array = pcVar4;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)ptVar3,__l,
               (allocator_type *)CONCAT17(vVar2,in_stack_ffffffffffffffb8));
    boost::program_options::typed_value<std::vector<char,_std::allocator<char>_>,_char>::
    default_value(ptVar3,(vector<char,_std::allocator<char>_> *)
                         CONCAT17(vVar2,in_stack_ffffffffffffffb8));
    std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbe);
    this_00 = uVar5;
  }
  ptVar3 = add_notifier<char>(in_RSI,(shared_ptr<VW::config::typed_option<char>_> *)this_00,
                              in_stack_ffffffffffffffe0);
  ptVar3 = boost::program_options::typed_value<std::vector<char,_std::allocator<char>_>,_char>::
           composing(ptVar3);
  return ptVar3;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}